

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

pair<const_slang::ast::ClassType_*,_bool> slang::ast::Lookup::getContainingClass(Scope *scope)

{
  bool bVar1;
  SubroutineSymbol *pSVar2;
  MethodPrototypeSymbol *pMVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  Scope *in_RDI;
  pair<const_slang::ast::ClassType_*,_bool> pVar5;
  Scope *parentScope;
  bool inStatic;
  Symbol *parent;
  anon_class_1_0_00000001 isClassElem;
  bitmask<slang::ast::MethodFlags> *in_stack_ffffffffffffffa8;
  bitmask<slang::ast::MethodFlags> *in_stack_ffffffffffffffb0;
  void *local_48;
  ClassType *local_40;
  Scope *local_38;
  bitmask<slang::ast::MethodFlags> local_2e;
  bitmask<slang::ast::MethodFlags> local_2c;
  bool local_29;
  Symbol *local_28;
  anon_class_1_0_00000001 local_19 [9];
  pair<const_slang::ast::ClassType_*,_bool> local_10;
  
  local_19[0] = (anon_class_1_0_00000001)0x0;
  local_28 = Scope::asSymbol(in_RDI);
  local_29 = false;
  while (bVar1 = getContainingClass::anon_class_1_0_00000001::operator()(local_19,local_28->kind),
        bVar1) {
    if (local_28->kind == Subroutine) {
      pSVar2 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x6989b5);
      in_stack_ffffffffffffffb0 = &pSVar2->flags;
      bitmask<slang::ast::MethodFlags>::bitmask(&local_2c,Static);
      bVar1 = bitmask<slang::ast::MethodFlags>::has
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (bVar1) {
        local_29 = true;
      }
    }
    else if (local_28->kind == MethodPrototype) {
      pMVar3 = Symbol::as<slang::ast::MethodPrototypeSymbol>((Symbol *)0x6989ff);
      in_stack_ffffffffffffffa8 = &pMVar3->flags;
      bitmask<slang::ast::MethodFlags>::bitmask(&local_2e,Static);
      bVar1 = bitmask<slang::ast::MethodFlags>::has
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (bVar1) {
        local_29 = true;
      }
    }
    local_38 = Symbol::getParentScope(local_28);
    local_28 = Scope::asSymbol(local_38);
  }
  if (local_28->kind == ClassType) {
    local_40 = Symbol::as<slang::ast::ClassType>((Symbol *)0x698a6e);
    std::pair<const_slang::ast::ClassType_*,_bool>::
    pair<const_slang::ast::ClassType_*,_bool_&,_true>(&local_10,&local_40,&local_29);
    uVar4 = extraout_RDX;
  }
  else {
    local_48 = (void *)0x0;
    std::pair<const_slang::ast::ClassType_*,_bool>::pair<std::nullptr_t,_bool_&,_true>
              (&local_10,&local_48,&local_29);
    uVar4 = extraout_RDX_00;
  }
  pVar5._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  pVar5.second = local_10.second;
  pVar5.first = local_10.first;
  return pVar5;
}

Assistant:

std::pair<const ClassType*, bool> Lookup::getContainingClass(const Scope& scope) {
    auto isClassElem = [](SymbolKind kind) {
        switch (kind) {
            case SymbolKind::StatementBlock:
            case SymbolKind::Subroutine:
            case SymbolKind::MethodPrototype:
            case SymbolKind::ConstraintBlock:
            case SymbolKind::RandSeqProduction:
            case SymbolKind::CovergroupBody:
            case SymbolKind::CovergroupType:
            case SymbolKind::Coverpoint:
            case SymbolKind::CoverCross:
                return true;
            default:
                return false;
        }
    };

    const Symbol* parent = &scope.asSymbol();
    bool inStatic = false;
    while (isClassElem(parent->kind)) {
        if (parent->kind == SymbolKind::Subroutine) {
            // Remember whether this was a static class method.
            if (parent->as<SubroutineSymbol>().flags.has(MethodFlags::Static))
                inStatic = true;
        }
        else if (parent->kind == SymbolKind::MethodPrototype) {
            if (parent->as<MethodPrototypeSymbol>().flags.has(MethodFlags::Static))
                inStatic = true;
        }

        auto parentScope = parent->getParentScope();
        SLANG_ASSERT(parentScope);
        parent = &parentScope->asSymbol();
    }

    if (parent->kind == SymbolKind::ClassType)
        return {&parent->as<ClassType>(), inStatic};

    return {nullptr, inStatic};
}